

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigRetMin.c
# Opt level: O2

Aig_Man_t * Saig_ManRetimeDupBackward(Aig_Man_t *p,Vec_Ptr_t *vCut,Vec_Int_t *vInit)

{
  int iVar1;
  Aig_Man_t *p_00;
  char *pcVar2;
  void *pvVar3;
  Aig_Obj_t *pAVar4;
  ulong uVar5;
  Aig_Obj_t *pAVar6;
  void *pvVar7;
  int iVar8;
  
  p_00 = Aig_ManStart(p->vObjs->nSize);
  pcVar2 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar2;
  pcVar2 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar2;
  p_00->nRegs = vCut->nSize;
  iVar8 = p->nTruePos;
  p_00->nTruePis = p->nTruePis;
  p_00->nTruePos = iVar8;
  Aig_ManCleanData(p);
  p->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p_00->pConst1;
  for (iVar8 = 0; iVar8 < p->nTruePis; iVar8 = iVar8 + 1) {
    pvVar3 = Vec_PtrEntry(p->vCis,iVar8);
    pAVar4 = Aig_ObjCreateCi(p_00);
    *(Aig_Obj_t **)((long)pvVar3 + 0x28) = pAVar4;
  }
  for (iVar8 = 0; iVar8 < vCut->nSize; iVar8 = iVar8 + 1) {
    pvVar3 = Vec_PtrEntry(vCut,iVar8);
    pAVar4 = Aig_ObjCreateCi(p_00);
    if (vInit == (Vec_Int_t *)0x0) {
      uVar5 = 0;
    }
    else {
      iVar1 = Vec_IntEntry(vInit,iVar8);
      uVar5 = (ulong)iVar1;
    }
    *(ulong *)((long)pvVar3 + 0x28) = uVar5 ^ (ulong)pAVar4;
  }
  for (iVar8 = 0; iVar1 = p->nRegs, iVar8 < iVar1; iVar8 = iVar8 + 1) {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,p->nTruePos + iVar8);
    Saig_ManRetimeDup_rec(p_00,(Aig_Obj_t *)((ulong)pAVar4->pFanin0 & 0xfffffffffffffffe));
    pAVar6 = Aig_ObjChild0Copy(pAVar4);
    (pAVar4->field_5).pData = pAVar6;
  }
  for (iVar8 = 0; iVar8 < iVar1; iVar8 = iVar8 + 1) {
    pAVar4 = Saig_ManLi(p,iVar8);
    pAVar6 = Saig_ManLo(p,iVar8);
    pAVar6->field_5 = pAVar4->field_5;
    iVar1 = p->nRegs;
  }
  for (iVar8 = 0; iVar8 < vCut->nSize; iVar8 = iVar8 + 1) {
    pvVar3 = Vec_PtrEntry(vCut,iVar8);
    if (0xfffffffd < (*(uint *)((long)pvVar3 + 0x18) & 7) - 7) {
      *(undefined8 *)((long)pvVar3 + 0x28) = 0;
    }
  }
  p->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p_00->pConst1;
  for (iVar8 = 0; iVar8 < p->nTruePis; iVar8 = iVar8 + 1) {
    pvVar3 = Vec_PtrEntry(p->vCis,iVar8);
    pvVar7 = Vec_PtrEntry(p_00->vCis,iVar8);
    *(void **)((long)pvVar3 + 0x28) = pvVar7;
  }
  for (iVar8 = 0; iVar8 < p->nTruePos; iVar8 = iVar8 + 1) {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,iVar8);
    Saig_ManRetimeDup_rec(p_00,(Aig_Obj_t *)((ulong)pAVar4->pFanin0 & 0xfffffffffffffffe));
    pAVar4 = Aig_ObjChild0Copy(pAVar4);
    Aig_ObjCreateCo(p_00,pAVar4);
  }
  for (iVar8 = 0; iVar8 < vCut->nSize; iVar8 = iVar8 + 1) {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(vCut,iVar8);
    Saig_ManRetimeDup_rec(p_00,pAVar4);
    pvVar3 = (pAVar4->field_5).pData;
    if (vInit == (Vec_Int_t *)0x0) {
      uVar5 = 0;
    }
    else {
      iVar1 = Vec_IntEntry(vInit,iVar8);
      uVar5 = (ulong)iVar1;
    }
    Aig_ObjCreateCo(p_00,(Aig_Obj_t *)(uVar5 ^ (ulong)pvVar3));
  }
  Aig_ManCleanup(p_00);
  return p_00;
}

Assistant:

Aig_Man_t * Saig_ManRetimeDupBackward( Aig_Man_t * p, Vec_Ptr_t * vCut, Vec_Int_t * vInit )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo;
    int i;
    // mark the cones under the cut
//    assert( Vec_PtrSize(vCut) == Saig_ManRetimeCountCut(p, vCut) );
    // create the new manager
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->nRegs = Vec_PtrSize(vCut);
    pNew->nTruePis = p->nTruePis;
    pNew->nTruePos = p->nTruePos;
    // create the true PIs
    Aig_ManCleanData( p );
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    Saig_ManForEachPi( p, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pNew );
    // create the registers
    Vec_PtrForEachEntry( Aig_Obj_t *, vCut, pObj, i )
        pObj->pData = Aig_NotCond( Aig_ObjCreateCi(pNew), vInit?Vec_IntEntry(vInit,i):0 );
    // duplicate logic above the cut and remember values
    Saig_ManForEachLi( p, pObj, i )
    {
        Saig_ManRetimeDup_rec( pNew, Aig_ObjFanin0(pObj) );
        pObj->pData = Aig_ObjChild0Copy(pObj);
    }
    // transfer values from the LIs to the LOs
    Saig_ManForEachLiLo( p, pObjLi, pObjLo, i )
        pObjLo->pData = pObjLi->pData;
    // erase the data values on the internal nodes of the cut
    Vec_PtrForEachEntry( Aig_Obj_t *, vCut, pObj, i )
        if ( Aig_ObjIsNode(pObj) )
            pObj->pData = NULL;
    // replicate the data on the constant node and the PIs
    pObj = Aig_ManConst1(p);
    pObj->pData = Aig_ManConst1(pNew);
    Saig_ManForEachPi( p, pObj, i )
        pObj->pData = Aig_ManCi( pNew, i );
    // duplicate logic below the cut
    Saig_ManForEachPo( p, pObj, i )
    {
        Saig_ManRetimeDup_rec( pNew, Aig_ObjFanin0(pObj) );
        Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    }
    Vec_PtrForEachEntry( Aig_Obj_t *, vCut, pObj, i )
    {
        Saig_ManRetimeDup_rec( pNew, pObj );
        Aig_ObjCreateCo( pNew, Aig_NotCond((Aig_Obj_t *)pObj->pData, vInit?Vec_IntEntry(vInit,i):0) );
    }
    Aig_ManCleanup( pNew );
    return pNew;
}